

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead80pq.c
# Opt level: O1

_Bool ascon_aead80pq_decrypt
                (uint8_t *plaintext,uint8_t *key,uint8_t *nonce,uint8_t *assoc_data,
                uint8_t *ciphertext,uint8_t *expected_tag,size_t assoc_data_len,
                size_t ciphertext_len,size_t expected_tag_len)

{
  size_t sVar1;
  _Bool local_89;
  ascon_aead_ctx_t local_88;
  
  ascon_aead80pq_init(&local_88,key,nonce);
  ascon_aead128_assoc_data_update(&local_88,assoc_data,assoc_data_len);
  sVar1 = ascon_aead128_decrypt_update(&local_88,plaintext,ciphertext,ciphertext_len);
  ascon_aead80pq_decrypt_final(&local_88,plaintext + sVar1,&local_89,expected_tag,expected_tag_len);
  return local_89;
}

Assistant:

ASCON_API bool
ascon_aead80pq_decrypt(uint8_t* plaintext,
                       const uint8_t key[ASCON_AEAD80pq_KEY_LEN],
                       const uint8_t nonce[ASCON_AEAD_NONCE_LEN],
                       const uint8_t* assoc_data,
                       const uint8_t* ciphertext,
                       const uint8_t* expected_tag,
                       size_t assoc_data_len,
                       size_t ciphertext_len,
                       size_t expected_tag_len)
{
    ASCON_ASSERT(ciphertext_len == 0 || plaintext != NULL);
    ASCON_ASSERT(key != NULL);
    ASCON_ASSERT(nonce != NULL);
    ASCON_ASSERT(assoc_data_len == 0 || assoc_data != NULL);
    ASCON_ASSERT(ciphertext_len == 0 || ciphertext != NULL);
    ASCON_ASSERT(expected_tag_len != 0 || expected_tag != NULL);
    ascon_aead_ctx_t ctx;
    bool is_tag_valid;
    ascon_aead80pq_init(&ctx, key, nonce);
    ascon_aead80pq_assoc_data_update(&ctx, assoc_data, assoc_data_len);
    const size_t new_pt_bytes = ascon_aead80pq_decrypt_update(&ctx,
                                                              plaintext,
                                                              ciphertext,
                                                              ciphertext_len);
    ascon_aead80pq_decrypt_final(&ctx, plaintext + new_pt_bytes,
                                 &is_tag_valid, expected_tag, expected_tag_len);
    return is_tag_valid;
}